

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::String> * __thiscall
kj::ArrayBuilder<kj::String>::operator=
          (ArrayBuilder<kj::String> *this,ArrayBuilder<kj::String> *other)

{
  String *pSVar1;
  RemoveConst<kj::String> *pRVar2;
  String *pSVar3;
  ArrayDisposer *pAVar4;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (String *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (String *)0x0;
    this->pos = (RemoveConst<kj::String> *)0x0;
    this->endPtr = (String *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x18,((long)pRVar2 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ((long)pSVar3 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (String *)0x0;
  other->pos = (RemoveConst<kj::String> *)0x0;
  other->endPtr = (String *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }